

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

bool __thiscall
ArgsManager::ReadConfigStream
          (ArgsManager *this,istream *stream,string *filepath,string *error,bool ignore_invalid_keys
          )

{
  list<SectionInfo,_std::allocator<SectionInfo>_> *__position;
  undefined1 *puVar1;
  long lVar2;
  string key;
  size_t sVar3;
  pointer ppVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  istream *piVar8;
  void *pvVar9;
  pointer pcVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  size_type sVar12;
  size_type sVar13;
  optional<unsigned_int> oVar14;
  mapped_type *this_00;
  mapped_type *this_01;
  undefined8 uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  char *pcVar17;
  size_type __n;
  uint uVar18;
  char *__data;
  long lVar19;
  _Alloc_hider _Var20;
  undefined8 uVar21;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  undefined4 uVar23;
  size_type __size;
  ulong uVar24;
  pointer args;
  _Alloc_hider this_02;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  undefined4 in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  ArgsManager *this_03;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  *this_04;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  int local_164;
  string_view value;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  optional<UniValue> value_1;
  long *local_e0 [2];
  long local_d0 [2];
  string str;
  key_type local_a0;
  string name;
  string prefix;
  
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(in_register_00000081,ignore_invalid_keys);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock2.super_unique_lock._M_owns = false;
  criticalblock2.super_unique_lock._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __position = &this->m_config_sections;
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = '\0';
  local_164 = 1;
  this_03 = this;
  while( true ) {
    cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (stream,(string *)&str,cVar5);
    _Var20 = str._M_dataplus;
    pcVar17 = *(char **)(*(long *)piVar8 + -0x18);
    uVar18 = *(uint *)(piVar8 + 0x20 + (long)pcVar17);
    if ((uVar18 & 5) != 0) break;
    uVar23 = 1;
    if (str._M_string_length != 0) {
      pvVar9 = memchr(str._M_dataplus._M_p,0x23,str._M_string_length);
      if ((long)pvVar9 - (long)_Var20._M_p != 0xffffffffffffffff && pvVar9 != (void *)0x0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1,
                   &str,0,(long)pvVar9 - (long)_Var20._M_p);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &value_1);
        if ((undefined1 *)
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
            (undefined1 *)
            ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
          operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                  super__Optional_payload<UniValue,_true,_false,_false>.
                                  super__Optional_payload_base<UniValue>._M_payload._0_8_,
                          value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                          super__Optional_payload<UniValue,_true,_false,_false>.
                          super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                          _M_string_length + 1);
        }
        uVar23 = 0;
      }
    }
    if (GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
        ::pattern_abi_cxx11_ == '\0') {
      ReadConfigStream();
    }
    sVar13 = str._M_string_length;
    _Var20._M_p = str._M_dataplus._M_p;
    sVar3 = DAT_006bd4a0;
    pcVar17 = GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
              ::pattern_abi_cxx11_;
    name._M_dataplus._M_p = (pointer)str._M_string_length;
    name._M_string_length = (size_type)str._M_dataplus._M_p;
    if (str._M_string_length == 0) {
LAB_003e4063:
      uVar24 = 0;
      lVar19 = 0;
    }
    else {
      if (DAT_006bd4a0 != 0) {
        this_02._M_p = (pointer)0x0;
        do {
          pvVar9 = memchr(pcVar17,(int)_Var20._M_p[(long)this_02._M_p],sVar3);
          if (pvVar9 == (void *)0x0) {
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02._M_p !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0xffffffffffffffff) {
              sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&name,pcVar17,
                                  0xffffffffffffffff,sVar3);
              uVar15 = name._M_dataplus;
              if (this_02._M_p <= name._M_dataplus._M_p) {
                sVar13 = sVar12 + 1;
                goto LAB_003e3f49;
              }
              if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_003e4d84;
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",this_02._M_p,name._M_dataplus._M_p);
              goto LAB_003e4ab1;
            }
            break;
          }
          this_02._M_p = (pointer)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)this_02._M_p)->_M_dataplus)._M_p + 1);
        } while ((pointer)sVar13 != this_02._M_p);
        goto LAB_003e4063;
      }
      this_02._M_p = (pointer)0x0;
LAB_003e3f49:
      uVar24 = (long)name._M_dataplus._M_p - (long)this_02._M_p;
      if (sVar13 - (long)this_02._M_p <= (ulong)((long)name._M_dataplus._M_p - (long)this_02._M_p))
      {
        uVar24 = sVar13 - (long)this_02._M_p;
      }
      lVar19 = (long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       this_02._M_p)->_M_dataplus)._M_p + name._M_string_length;
    }
    puVar1 = (undefined1 *)
             ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                     super__Optional_payload<UniValue,_true,_false,_false>.
                     super__Optional_payload_base<UniValue>._M_payload + 0x10);
    value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value_1,lVar19,uVar24 + lVar19);
    this_02._M_p = (pointer)&str;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02._M_p,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1);
    if ((undefined1 *)
        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
        super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>
        ._M_payload._0_8_ != puVar1) {
      operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                              super__Optional_payload<UniValue,_true,_false,_false>.
                              super__Optional_payload_base<UniValue>._M_payload._0_8_,
                      value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                      super__Optional_payload<UniValue,_true,_false,_false>.
                      super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                      _M_string_length + 1);
    }
    pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              str._M_string_length;
    _Var20._M_p = str._M_dataplus._M_p;
    if (str._M_string_length != 0) {
      if (*str._M_dataplus._M_p != '[') {
        if (*str._M_dataplus._M_p != '-') goto LAB_003e3fea;
        pcVar17 = (char *)&str;
        tinyformat::format<int,std::__cxx11::string>
                  ((string *)&value_1,
                   (tinyformat *)
                   "parse error on line %i: %s, options in configuration file must be specified without leading -"
                   ,(char *)&local_164,(int *)pcVar17,args_1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &value_1);
        uVar15 = value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                 super__Optional_payload<UniValue,_true,_false,_false>.
                 super__Optional_payload_base<UniValue>._M_payload._M_value.val._M_string_length;
        uVar21 = value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                 super__Optional_payload<UniValue,_true,_false,_false>.
                 super__Optional_payload_base<UniValue>._M_payload._0_8_;
        in_stack_fffffffffffffe44 = uVar18;
        if ((undefined1 *)
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
            (undefined1 *)
            ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
LAB_003e475b:
          operator_delete((void *)uVar21,uVar15 + 1);
        }
        break;
      }
      if (str._M_dataplus._M_p[str._M_string_length - 1] == ']') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&name,&str,1,str._M_string_length - 2);
        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
        super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>
        ._M_payload._0_8_ =
             (long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&value_1,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
        super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>
        ._M_payload._32_8_ =
             (long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x30;
        pcVar10 = (filepath->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                           super__Optional_payload<UniValue,_true,_false,_false>.
                           super__Optional_payload_base<UniValue>._M_payload + 0x20),pcVar10,
                   pcVar10 + filepath->_M_string_length);
        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
        super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>
        ._M_payload._64_4_ = local_164;
        std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::_M_insert<SectionInfo>
                  (__position,(iterator)__position,(SectionInfo *)&value_1);
        if ((undefined1 *)
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._32_8_ !=
            (undefined1 *)
            ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x30)) {
          operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                  super__Optional_payload<UniValue,_true,_false,_false>.
                                  super__Optional_payload_base<UniValue>._M_payload._32_8_,
                          (ulong)((long)&((value_1.super__Optional_base<UniValue,_false,_false>.
                                           _M_payload.
                                           super__Optional_payload<UniValue,_true,_false,_false>.
                                           super__Optional_payload_base<UniValue>._M_payload.
                                           _M_value.keys.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)
                                         ._M_p + 1));
        }
        if ((undefined1 *)
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
            (undefined1 *)
            ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
          operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                  super__Optional_payload<UniValue,_true,_false,_false>.
                                  super__Optional_payload_base<UniValue>._M_payload._0_8_,
                          value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                          super__Optional_payload<UniValue,_true,_false,_false>.
                          super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                          _M_string_length + 1);
        }
        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
        super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>
        ._M_payload._0_8_ =
             (long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&value_1,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1
                       ,(size_type)
                        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                        super__Optional_payload<UniValue,_true,_false,_false>.
                        super__Optional_payload_base<UniValue>._M_payload._M_value.val._M_dataplus.
                        _M_p,0,1,'.');
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&prefix,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &value_1);
LAB_003e4519:
        if ((undefined1 *)
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
            (undefined1 *)
            ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
          operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                  super__Optional_payload<UniValue,_true,_false,_false>.
                                  super__Optional_payload_base<UniValue>._M_payload._0_8_,
                          value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                          super__Optional_payload<UniValue,_true,_false,_false>.
                          super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                          _M_string_length + 1);
        }
      }
      else {
LAB_003e3fea:
        pcVar10 = (pointer)memchr(str._M_dataplus._M_p,0x3d,str._M_string_length);
        sVar3 = DAT_006bd4a0;
        pcVar17 = GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
                  ::pattern_abi_cxx11_;
        if ((pcVar10 == (pointer)0x0) ||
           (pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (pcVar10 + -(long)_Var20._M_p),
           pbVar22 ==
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff))
        {
          pcVar17 = (char *)&str;
          tinyformat::format<int,std::__cxx11::string>
                    ((string *)&value_1,(tinyformat *)"parse error on line %i: %s",
                     (char *)&local_164,(int *)pcVar17,args_1);
          this = this_03;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &value_1);
          in_stack_fffffffffffffe44 = uVar18;
          this_03 = this;
          if ((undefined1 *)
              value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
              super__Optional_payload<UniValue,_true,_false,_false>.
              super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
              (undefined1 *)
              ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                      super__Optional_payload<UniValue,_true,_false,_false>.
                      super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
            operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                    super__Optional_payload<UniValue,_true,_false,_false>.
                                    super__Optional_payload_base<UniValue>._M_payload._0_8_,
                            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                            super__Optional_payload<UniValue,_true,_false,_false>.
                            super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                            _M_string_length + 1);
          }
          if (1 < str._M_string_length) {
            pcVar17 = (char *)0x2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1
                       ,&str,0,2);
            iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &value_1,"no");
            if ((undefined1 *)
                value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                super__Optional_payload<UniValue,_true,_false,_false>.
                super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
                (undefined1 *)
                ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                        super__Optional_payload<UniValue,_true,_false,_false>.
                        super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
              operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<UniValue,_true,_false,_false>.
                                      super__Optional_payload_base<UniValue>._M_payload._0_8_,
                              value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                              super__Optional_payload<UniValue,_true,_false,_false>.
                              super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                              _M_string_length + 1);
            }
            if (iVar7 == 0) {
              tinyformat::format<std::__cxx11::string>
                        ((string *)&value_1,
                         (tinyformat *)
                         ", if you intended to specify a negated option, use %s=1 instead",
                         (char *)&str,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pcVar17);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(error,(char *)value_1.super__Optional_base<UniValue,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<UniValue,_true,_false,_false>.
                                      super__Optional_payload_base<UniValue>._M_payload._0_8_,
                        (size_type)
                        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                        super__Optional_payload<UniValue,_true,_false,_false>.
                        super__Optional_payload_base<UniValue>._M_payload._M_value.val._M_dataplus.
                        _M_p);
              uVar15 = value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                       super__Optional_payload<UniValue,_true,_false,_false>.
                       super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                       _M_string_length;
              uVar21 = value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                       super__Optional_payload<UniValue,_true,_false,_false>.
                       super__Optional_payload_base<UniValue>._M_payload._0_8_;
              if ((undefined1 *)
                  value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                  super__Optional_payload<UniValue,_true,_false,_false>.
                  super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
                  (undefined1 *)
                  ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                          super__Optional_payload<UniValue,_true,_false,_false>.
                          super__Optional_payload_base<UniValue>._M_payload + 0x10))
              goto LAB_003e475b;
            }
          }
          break;
        }
        if (pbVar22 <= pbVar11) {
          pbVar11 = pbVar22;
        }
        value._M_str = _Var20._M_p;
        value._M_len = (size_t)pbVar11;
        if (pcVar10 == _Var20._M_p) {
LAB_003e40ca:
          uVar24 = 0;
          pcVar17 = (char *)0x0;
          this = this_03;
        }
        else {
          if (DAT_006bd4a0 != 0) {
            this_02._M_p = (pointer)0x0;
            do {
              pvVar9 = memchr(pcVar17,(int)_Var20._M_p[(long)this_02._M_p],sVar3);
              if (pvVar9 == (void *)0x0) {
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    this_02._M_p !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    0xffffffffffffffff) {
                  sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                                     (&value,pcVar17,0xffffffffffffffff,sVar3);
                  uVar15 = value._M_len;
                  if (value._M_len < this_02._M_p) goto LAB_003e4ae3;
                  pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (sVar12 + 1);
                  goto LAB_003e40b0;
                }
                break;
              }
              this_02._M_p = (pointer)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)this_02._M_p)->_M_dataplus)._M_p + 1);
            } while (pbVar11 !=
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     this_02._M_p);
            goto LAB_003e40ca;
          }
          this_02._M_p = (pointer)0x0;
LAB_003e40b0:
          uVar24 = value._M_len - (long)this_02._M_p;
          if ((ulong)((long)pbVar11 - (long)this_02._M_p) <= value._M_len - (long)this_02._M_p) {
            uVar24 = (long)pbVar11 - (long)this_02._M_p;
          }
          pcVar17 = value._M_str + (long)this_02._M_p;
          this = this_03;
        }
        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
        super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>
        ._M_payload._0_8_ =
             (long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&value_1,pcVar17,pcVar17 + uVar24)
        ;
        args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 prefix._M_string_length;
        pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &value_1,0,0,prefix._M_dataplus._M_p,prefix._M_string_length);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        pcVar10 = (pbVar11->_M_dataplus)._M_p;
        paVar16 = &pbVar11->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar10 == paVar16) {
          name.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          name.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        }
        else {
          name.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          name._M_dataplus._M_p = pcVar10;
        }
        name._M_string_length = pbVar11->_M_string_length;
        (pbVar11->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar11->_M_string_length = 0;
        (pbVar11->field_2)._M_local_buf[0] = '\0';
        if ((undefined1 *)
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
            (undefined1 *)
            ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
          operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                  super__Optional_payload<UniValue,_true,_false,_false>.
                                  super__Optional_payload_base<UniValue>._M_payload._0_8_,
                          value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                          super__Optional_payload<UniValue,_true,_false,_false>.
                          super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                          _M_string_length + 1);
        }
        sVar3 = DAT_006bd4a0;
        pcVar17 = GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
                  ::pattern_abi_cxx11_;
        cVar5 = (char)uVar23;
        _Var20._M_p = (pointer)((long)&(pbVar22->_M_dataplus)._M_p + 1);
        uVar15 = str._M_string_length;
        if (str._M_string_length <= pbVar22) {
LAB_003e4ab1:
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",_Var20._M_p,uVar15);
LAB_003e4ae3:
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              uVar15 = std::__throw_out_of_range_fmt
                                 ("%s: __pos (which is %zu) > __size (which is %zu)",
                                  "basic_string_view::substr",this_02._M_p,uVar15);
              if ((undefined1 *)
                  value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                  super__Optional_payload<UniValue,_true,_false,_false>.
                  super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
                  (undefined1 *)
                  ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                          super__Optional_payload<UniValue,_true,_false,_false>.
                          super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
                operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<UniValue,_true,_false,_false>.
                                        super__Optional_payload_base<UniValue>._M_payload._0_8_,
                                value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                super__Optional_payload<UniValue,_true,_false,_false>.
                                super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                                _M_string_length + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)prefix._M_dataplus._M_p != &prefix.field_2) {
                operator_delete(prefix._M_dataplus._M_p,
                                CONCAT71(prefix.field_2._M_allocated_capacity._1_7_,
                                         prefix.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)str._M_dataplus._M_p != &str.field_2) {
                operator_delete(str._M_dataplus._M_p,
                                CONCAT71(str.field_2._M_allocated_capacity._1_7_,
                                         str.field_2._M_local_buf[0]) + 1);
              }
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector(&options);
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        (&criticalblock2.super_unique_lock);
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                _Unwind_Resume(uVar15);
              }
            }
          }
          goto LAB_003e4d84;
        }
        this_02._M_p = str._M_dataplus._M_p + (long)_Var20._M_p;
        pcVar10 = (pointer)(str._M_string_length - (long)_Var20._M_p);
        this_03 = this;
        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
        super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>
        ._M_payload._0_8_ = pcVar10;
        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
        super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>
        ._M_payload._M_value.val._M_dataplus._M_p = (_Alloc_hider)this_02._M_p;
        if (pcVar10 == (pointer)0x0) {
LAB_003e425e:
          value._M_len = 0;
          value._M_str = (char *)0x0;
        }
        else {
          if (DAT_006bd4a0 != 0) {
            _Var20._M_p = (pointer)0x0;
            do {
              pvVar9 = memchr(pcVar17,(int)this_02._M_p[(long)_Var20._M_p],sVar3);
              cVar5 = (char)uVar23;
              if (pvVar9 == (void *)0x0) {
                if (_Var20._M_p != (pointer)0xffffffffffffffff) {
                  sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                                     ((basic_string_view<char,_std::char_traits<char>_> *)&value_1,
                                      pcVar17,0xffffffffffffffff,sVar3);
                  uVar15 = value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                           super__Optional_payload<UniValue,_true,_false,_false>.
                           super__Optional_payload_base<UniValue>._M_payload._0_8_;
                  if ((ulong)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                             super__Optional_payload<UniValue,_true,_false,_false>.
                             super__Optional_payload_base<UniValue>._M_payload._0_8_ < _Var20._M_p)
                  goto LAB_003e4ab1;
                  pcVar10 = (pointer)(sVar12 + 1);
                  goto LAB_003e4244;
                }
                break;
              }
              _Var20._M_p = _Var20._M_p + 1;
            } while (pcVar10 != _Var20._M_p);
            goto LAB_003e425e;
          }
          _Var20._M_p = (pointer)0x0;
LAB_003e4244:
          value._M_len = value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                         super__Optional_payload<UniValue,_true,_false,_false>.
                         super__Optional_payload_base<UniValue>._M_payload._0_8_ - (long)_Var20._M_p
          ;
          if ((ulong)((long)pcVar10 - (long)_Var20._M_p) <=
              (ulong)(value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                      super__Optional_payload<UniValue,_true,_false,_false>.
                      super__Optional_payload_base<UniValue>._M_payload._0_8_ - (long)_Var20._M_p))
          {
            value._M_len = (long)pcVar10 - (long)_Var20._M_p;
          }
          value._M_str = _Var20._M_p +
                         (long)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                               super__Optional_payload<UniValue,_true,_false,_false>.
                               super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                               _M_dataplus._M_p;
        }
        if (cVar5 == '\0') {
          pcVar17 = (char *)0xb;
          sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find(&name,"rpcpassword",0,0xb);
          if (sVar13 != 0xffffffffffffffff) {
            tinyformat::format<int>
                      ((string *)&value_1,
                       "parse error on line %i, using # in rpcpassword can be ambiguous and should be avoided"
                       ,&local_164);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &value_1);
            in_stack_fffffffffffffe44 = uVar18;
            if ((undefined1 *)
                value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                super__Optional_payload<UniValue,_true,_false,_false>.
                super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
                (undefined1 *)
                ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                        super__Optional_payload<UniValue,_true,_false,_false>.
                        super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
              operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<UniValue,_true,_false,_false>.
                                      super__Optional_payload_base<UniValue>._M_payload._0_8_,
                              value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                              super__Optional_payload<UniValue,_true,_false,_false>.
                              super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                              _M_string_length + 1);
            }
            uVar15 = name.field_2._M_allocated_capacity;
            uVar21 = name._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) goto LAB_003e475b;
            break;
          }
        }
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)&options,&name,&value);
        sVar13 = name._M_string_length;
        if (name._M_string_length != 0) {
          do {
            __n = sVar13 - 1;
            if (sVar13 == 0) goto LAB_003e4546;
            lVar19 = sVar13 - 1;
            sVar13 = __n;
          } while (name._M_dataplus._M_p[lVar19] != '.');
          if (prefix._M_string_length <= __n) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1
                       ,&name,0,__n);
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._32_8_ =
                 (long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                        super__Optional_payload<UniValue,_true,_false,_false>.
                        super__Optional_payload_base<UniValue>._M_payload + 0x30;
            pcVar10 = (filepath->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                               super__Optional_payload<UniValue,_true,_false,_false>.
                               super__Optional_payload_base<UniValue>._M_payload + 0x20),pcVar10,
                       pcVar10 + filepath->_M_string_length);
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._64_4_ = local_164;
            std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::_M_insert<SectionInfo>
                      (__position,(iterator)__position,(SectionInfo *)&value_1);
            if ((undefined1 *)
                value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                super__Optional_payload<UniValue,_true,_false,_false>.
                super__Optional_payload_base<UniValue>._M_payload._32_8_ !=
                (undefined1 *)
                ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                        super__Optional_payload<UniValue,_true,_false,_false>.
                        super__Optional_payload_base<UniValue>._M_payload + 0x30)) {
              operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<UniValue,_true,_false,_false>.
                                      super__Optional_payload_base<UniValue>._M_payload._32_8_,
                              (ulong)((long)&((value_1.super__Optional_base<UniValue,_false,_false>.
                                               _M_payload.
                                               super__Optional_payload<UniValue,_true,_false,_false>
                                               .super__Optional_payload_base<UniValue>._M_payload.
                                               _M_value.keys.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish)->
                                             _M_dataplus)._M_p + 1));
            }
            goto LAB_003e4519;
          }
        }
      }
LAB_003e4546:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
    }
    local_164 = local_164 + 1;
    in_stack_fffffffffffffe44 = uVar18;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prefix._M_dataplus._M_p != &prefix.field_2) {
    operator_delete(prefix._M_dataplus._M_p,
                    CONCAT71(prefix.field_2._M_allocated_capacity._1_7_,
                             prefix.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p,
                    CONCAT71(str.field_2._M_allocated_capacity._1_7_,str.field_2._M_local_buf[0]) +
                    1);
  }
  ppVar4 = options.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((uVar18 & 5) == 0) {
LAB_003e4a3e:
    bVar6 = false;
  }
  else {
    bVar6 = true;
    if (options.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        options.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_04 = &(this->m_settings).ro_config;
      args = options.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_e0[0] = local_d0;
        pcVar10 = (args->first)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e0,pcVar10,pcVar10 + (args->first)._M_string_length);
        key._M_string_length._0_4_ = in_stack_fffffffffffffe40;
        key._M_dataplus._M_p = (pointer)error;
        key._M_string_length._4_4_ = in_stack_fffffffffffffe44;
        key.field_2._M_allocated_capacity = (size_type)this_03;
        key.field_2._8_4_ = (int)this_04;
        key.field_2._12_4_ = (int)((ulong)this_04 >> 0x20);
        InterpretKey((KeyInfo *)&str,key);
        if (local_e0[0] != local_d0) {
          operator_delete(local_e0[0],local_d0[0] + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1
                       ,'-',(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &str);
        oVar14 = GetArgFlags(this_03,(string *)&value_1);
        if ((undefined1 *)
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
            (undefined1 *)
            ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
          operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                  super__Optional_payload<UniValue,_true,_false,_false>.
                                  super__Optional_payload_base<UniValue>._M_payload._0_8_,
                          value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                          super__Optional_payload<UniValue,_true,_false,_false>.
                          super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                          _M_string_length + 1);
        }
        bVar6 = IsConfSupported((KeyInfo *)&str,error);
        if (!bVar6) {
LAB_003e49f4:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str._M_dataplus._M_p != &str.field_2) {
            operator_delete(str._M_dataplus._M_p,
                            CONCAT71(str.field_2._M_allocated_capacity._1_7_,
                                     str.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_003e4a3e;
        }
        if (((ulong)oVar14.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
          if (!ignore_invalid_keys) {
            tinyformat::format<std::__cxx11::string>
                      ((string *)&value_1,(tinyformat *)"Invalid configuration value %s",
                       (char *)args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar17)
            ;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &value_1);
            if ((undefined1 *)
                value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                super__Optional_payload<UniValue,_true,_false,_false>.
                super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
                (undefined1 *)
                ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                        super__Optional_payload<UniValue,_true,_false,_false>.
                        super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
              operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<UniValue,_true,_false,_false>.
                                      super__Optional_payload_base<UniValue>._M_payload._0_8_,
                              value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                              super__Optional_payload<UniValue,_true,_false,_false>.
                              super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                              _M_string_length + 1);
            }
            goto LAB_003e49f4;
          }
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
          ;
          source_file._M_len = 0x61;
          pcVar17 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
          ;
          logging_function._M_str = "ReadConfigStream";
          logging_function._M_len = 0x10;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function,source_file,0x6f,ALL,Info,(ConstevalFormatString<1U>)0x4d2176,
                     &args->first);
        }
        else {
          pcVar17 = (char *)((ulong)oVar14.super__Optional_base<unsigned_int,_true,_true>._M_payload
                                    .super__Optional_payload_base<unsigned_int> & 0xffffffff);
          InterpretValue(&value_1,(KeyInfo *)&str,&args->second,
                         oVar14.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_int>._M_payload,error);
          if (value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
              super__Optional_payload<UniValue,_true,_false,_false>.
              super__Optional_payload_base<UniValue>._M_engaged == false) goto LAB_003e49f4;
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                    ::operator[](this_04,&local_a0);
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                    ::operator[](this_00,(key_type *)&str);
          std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                    (this_01,(value_type *)&value_1);
          if (value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
              super__Optional_payload<UniValue,_true,_false,_false>.
              super__Optional_payload_base<UniValue>._M_engaged == true) {
            ::wallet::_GLOBAL__N_1::std::_Optional_payload_base<UniValue>::_M_destroy
                      ((_Optional_payload_base<UniValue> *)&value_1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,
                          CONCAT71(str.field_2._M_allocated_capacity._1_7_,
                                   str.field_2._M_local_buf[0]) + 1);
        }
        args = args + 1;
      } while (args != ppVar4);
      bVar6 = true;
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&options);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar6;
  }
LAB_003e4d84:
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::ReadConfigStream(std::istream& stream, const std::string& filepath, std::string& error, bool ignore_invalid_keys)
{
    LOCK(cs_args);
    std::vector<std::pair<std::string, std::string>> options;
    if (!GetConfigOptions(stream, filepath, error, options, m_config_sections)) {
        return false;
    }
    for (const std::pair<std::string, std::string>& option : options) {
        KeyInfo key = InterpretKey(option.first);
        std::optional<unsigned int> flags = GetArgFlags('-' + key.name);
        if (!IsConfSupported(key, error)) return false;
        if (flags) {
            std::optional<common::SettingsValue> value = InterpretValue(key, &option.second, *flags, error);
            if (!value) {
                return false;
            }
            m_settings.ro_config[key.section][key.name].push_back(*value);
        } else {
            if (ignore_invalid_keys) {
                LogPrintf("Ignoring unknown configuration value %s\n", option.first);
            } else {
                error = strprintf("Invalid configuration value %s", option.first);
                return false;
            }
        }
    }
    return true;
}